

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O2

void __thiscall cmVariableWatchCommand::~cmVariableWatchCommand(cmVariableWatchCommand *this)

{
  cmake *pcVar1;
  _Base_ptr p_Var2;
  
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmVariableWatchCommand_00648bc8;
  for (p_Var2 = (this->WatchedVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->WatchedVariables)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    pcVar1 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    cmVariableWatch::RemoveWatch
              (pcVar1->VariableWatch,(string *)(p_Var2 + 1),cmVariableWatchCommandVariableAccessed,
               (void *)0x0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->WatchedVariables)._M_t);
  cmCommand::~cmCommand(&this->super_cmCommand);
  return;
}

Assistant:

cmVariableWatchCommand::~cmVariableWatchCommand()
{
  std::set<std::string>::const_iterator it;
  for (it = this->WatchedVariables.begin(); it != this->WatchedVariables.end();
       ++it) {
    this->Makefile->GetCMakeInstance()->GetVariableWatch()->RemoveWatch(
      *it, cmVariableWatchCommandVariableAccessed);
  }
}